

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

void __thiscall FileEntryInfo::addExtent(FileEntryInfo *this,Extent *extent)

{
  pointer *ppEVar1;
  iterator __position;
  ulong uVar2;
  int64_t iVar3;
  undefined4 uVar4;
  long lVar5;
  ulong uVar6;
  
  __position._M_current =
       (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
      super__Vector_impl_data._M_start != __position._M_current) {
    uVar2 = __position._M_current[-1].size;
    uVar6 = uVar2 + 0x7ff;
    if (-1 < (long)uVar2) {
      uVar6 = uVar2;
    }
    if (((int)(uVar6 >> 0xb) + __position._M_current[-1].lbnPos == extent->lbnPos) &&
       (lVar5 = uVar2 + extent->size, lVar5 < 0x40000000)) {
      __position._M_current[-1].size = lVar5;
      goto LAB_0018fe27;
    }
  }
  if (__position._M_current ==
      (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Extent,std::allocator<Extent>>::_M_realloc_insert<Extent_const&>
              ((vector<Extent,std::allocator<Extent>> *)&this->m_extents,__position,extent);
  }
  else {
    uVar4 = *(undefined4 *)&extent->field_0x4;
    iVar3 = extent->size;
    (__position._M_current)->lbnPos = extent->lbnPos;
    *(undefined4 *)&(__position._M_current)->field_0x4 = uVar4;
    (__position._M_current)->size = iVar3;
    ppEVar1 = &(this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
LAB_0018fe27:
  this->m_fileSize = this->m_fileSize + extent->size;
  return;
}

Assistant:

void FileEntryInfo::addExtent(const Extent &extent)
{
    if (m_extents.empty())
    {
        m_extents.push_back(extent);
    }
    else
    {
        const int lastLBN = m_extents.rbegin()->lbnPos + static_cast<int>(m_extents.rbegin()->size / SECTOR_SIZE);
        if (lastLBN == extent.lbnPos && m_extents.rbegin()->size + extent.size < MAX_EXTENT_SIZE)
            m_extents.rbegin()->size += extent.size;
        else
            m_extents.push_back(extent);
    }
    m_fileSize += extent.size;
}